

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

counting_iterator<char> __thiscall
fmt::v5::internal::
format_decimal<char,unsigned_int,fmt::v5::internal::counting_iterator<char>,fmt::v5::internal::no_thousands_sep>
          (internal *this,uint param_2,undefined4 param_3,undefined4 value,undefined8 param_5)

{
  char *__first;
  counting_iterator<char> cVar1;
  char_type buffer [13];
  __copy_move<false,false,std::random_access_iterator_tag> local_25 [13];
  
  __first = format_decimal<unsigned_int,char,fmt::v5::internal::no_thousands_sep>
                      (local_25,param_3,value);
  cVar1.count_ = (ulong)param_2;
  cVar1._8_8_ = param_5;
  cVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,fmt::v5::internal::counting_iterator<char>>
                    (local_25,__first,(char *)this,cVar1);
  return cVar1;
}

Assistant:

inline Iterator format_decimal(
    Iterator out, UInt value, int num_digits, ThousandsSep sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  typedef typename ThousandsSep::char_type char_type;
  // Buffer should be large enough to hold all digits (<= digits10 + 1).
  enum { max_size = std::numeric_limits<UInt>::digits10 + 1 };
  FMT_ASSERT(ThousandsSep::size <= 1, "invalid separator");
  char_type buffer[max_size + max_size / 3];
  auto end = format_decimal(buffer, value, num_digits, sep);
  return internal::copy_str<OutChar>(buffer, end, out);
}